

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lmi_helper.c
# Opt level: O1

uint64_t helper_paddush_mips64el(uint64_t fs,uint64_t ft)

{
  long lVar1;
  undefined2 uVar2;
  uint uVar3;
  LMIValue vs;
  LMIValue vt;
  
  vs.d = fs;
  vt.d = ft;
  lVar1 = 0;
  do {
    uVar3 = (uint)*(ushort *)((long)&vt + lVar1 * 2) + (uint)*(ushort *)((long)&vs + lVar1 * 2);
    uVar2 = (undefined2)uVar3;
    if (0xfffe < uVar3) {
      uVar2 = 0xffff;
    }
    *(undefined2 *)((long)&vs + lVar1 * 2) = uVar2;
    lVar1 = lVar1 + 1;
  } while (lVar1 != 4);
  return vs.d;
}

Assistant:

uint64_t helper_paddush(uint64_t fs, uint64_t ft)
{
    LMIValue vs, vt;
    unsigned int i;

    vs.d = fs;
    vt.d = ft;
    for (i = 0; i < 4; ++i) {
        int r = vs.uh[i] + vt.uh[i];
        vs.uh[i] = SATUH(r);
    }
    return vs.d;
}